

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes LookToRead_Read(void *pp,void *buf,size_t *size)

{
  size_t local_38;
  size_t rem;
  CLookToRead *p;
  size_t *size_local;
  void *buf_local;
  void *pp_local;
  
  local_38 = *(long *)((long)pp + 0x30) - *(long *)((long)pp + 0x28);
  if (local_38 == 0) {
    pp_local._4_4_ =
         (*(code *)**(undefined8 **)((long)pp + 0x20))(*(undefined8 *)((long)pp + 0x20),buf,size);
  }
  else {
    if (*size < local_38) {
      local_38 = *size;
    }
    memcpy(buf,(void *)((long)pp + *(long *)((long)pp + 0x28) + 0x38),local_38);
    *(size_t *)((long)pp + 0x28) = local_38 + *(long *)((long)pp + 0x28);
    *size = local_38;
    pp_local._4_4_ = 0;
  }
  return pp_local._4_4_;
}

Assistant:

static SRes LookToRead_Read(void *pp, void *buf, size_t *size)
{
  CLookToRead *p = (CLookToRead *)pp;
  size_t rem = p->size - p->pos;
  if (rem == 0)
    return p->realStream->Read(p->realStream, buf, size);
  if (rem > *size)
    rem = *size;
  memcpy(buf, p->buf + p->pos, rem);
  p->pos += rem;
  *size = rem;
  return SZ_OK;
}